

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.h
# Opt level: O0

void __thiscall Tick::Tick(Tick *this,microseconds timeBetweenTicks,function<void_()> *onTick)

{
  type local_28;
  function<void_()> *local_20;
  function<void_()> *onTick_local;
  Tick *this_local;
  microseconds timeBetweenTicks_local;
  
  local_20 = onTick;
  onTick_local = &this->onTick_;
  this_local = (Tick *)timeBetweenTicks.__r;
  std::function<void_()>::function(&this->onTick_,onTick);
  (this->timeBetweenTicks_).__r = (rep)this_local;
  std::atomic<bool>::atomic(&this->active_,true);
  local_28.this = this;
  std::thread::
  thread<Tick::Tick(std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>&&)::_lambda()_1_,,void>
            (&this->timerThread_,&local_28);
  return;
}

Assistant:

Tick(std::chrono::microseconds timeBetweenTicks,
         std::function<void()>&& onTick)
        : timeBetweenTicks_(timeBetweenTicks)
        , onTick_(std::move(onTick))
        , active_(true)
        , timerThread_([this] { Loop(); }) // note initialization order is very important here; 
                                            // thread should start last
    {}